

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::nativeBind
          (QNativeSocketEnginePrivate *this,QHostAddress *address,quint16 port)

{
  int iVar1;
  uint16_t uVar2;
  NetworkLayerProtocol NVar3;
  ErrorString errorString;
  quint32 __hostlong;
  uint32_t uVar4;
  int *piVar5;
  uint16_t in_DX;
  QNativeSocketEnginePrivate *in_RSI;
  bool *in_RDI;
  long in_FS_OFFSET;
  int bindResult;
  int ipv6only;
  socklen_t sockAddrSize;
  qt_sockaddr aa;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  bool *ok;
  undefined4 in_stack_ffffffffffffffd0;
  bool bVar6;
  undefined4 in_stack_ffffffffffffffd4;
  sockaddr local_24;
  undefined8 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24.sa_family = 0xaaaa;
  local_24.sa_data[0] = -0x56;
  local_24.sa_data[1] = -0x56;
  local_24.sa_data[2] = -0x56;
  local_24.sa_data[3] = -0x56;
  local_24.sa_data[4] = -0x56;
  local_24.sa_data[5] = -0x56;
  local_24.sa_data[6] = -0x56;
  local_24.sa_data[7] = -0x56;
  local_24.sa_data[8] = -0x56;
  local_24.sa_data[9] = -0x56;
  local_24.sa_data[10] = -0x56;
  local_24.sa_data[0xb] = -0x56;
  local_24.sa_data[0xc] = -0x56;
  local_24.sa_data[0xd] = -0x56;
  local_14 = 0xaaaaaaaaaaaaaaaa;
  local_c = 0xaaaaaaaa;
  ok = in_RDI;
  setPortAndAddress((QNativeSocketEnginePrivate *)
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (quint16)((ulong)in_RDI >> 0x30),(QHostAddress *)in_RSI,
                    (qt_sockaddr *)
                    CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
                    (socklen_t *)in_RDI);
  if (local_24.sa_family == 10) {
    in_stack_ffffffffffffffd4 = 0;
    NVar3 = QHostAddress::protocol((QHostAddress *)0x35a760);
    if (NVar3 == IPv6Protocol) {
      in_stack_ffffffffffffffd4 = 1;
    }
    setsockopt((int)*(undefined8 *)(in_RDI + 0xd8),0x29,0x1a,&stack0xffffffffffffffd4,4);
  }
  errorString = bind((int)*(undefined8 *)(in_RDI + 0xd8),&local_24,0xaaaaaaaa);
  if (((errorString < NonBlockingInitFailedErrorString) &&
      (piVar5 = __errno_location(), *piVar5 == 0x61)) &&
     (NVar3 = QHostAddress::protocol((QHostAddress *)0x35a7d0), NVar3 == AnyIPProtocol)) {
    local_24.sa_family = 2;
    uVar2 = htons(in_DX);
    local_24.sa_data._0_2_ = uVar2;
    __hostlong = QHostAddress::toIPv4Address
                           ((QHostAddress *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),ok);
    uVar4 = htonl(__hostlong);
    local_24.sa_data._2_4_ = uVar4;
    errorString = bind((int)*(undefined8 *)(in_RDI + 0xd8),&local_24,0x10);
  }
  if (errorString < NonBlockingInitFailedErrorString) {
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    if (iVar1 == 0xd) {
      setError(in_RSI,CONCAT22(in_DX,in_stack_ffffffffffffffbc),errorString);
    }
    else if (iVar1 == 0x16) {
      setError(in_RSI,CONCAT22(in_DX,in_stack_ffffffffffffffbc),errorString);
    }
    else if (iVar1 == 0x62) {
      setError(in_RSI,CONCAT22(in_DX,in_stack_ffffffffffffffbc),errorString);
    }
    else if (iVar1 == 99) {
      setError(in_RSI,CONCAT22(in_DX,in_stack_ffffffffffffffbc),errorString);
    }
    bVar6 = false;
  }
  else {
    in_RDI[0x98] = true;
    in_RDI[0x99] = false;
    in_RDI[0x9a] = false;
    in_RDI[0x9b] = false;
    bVar6 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QNativeSocketEnginePrivate::nativeBind(const QHostAddress &address, quint16 port)
{
    qt_sockaddr aa;
    QT_SOCKLEN_T sockAddrSize;
    setPortAndAddress(port, address, &aa, &sockAddrSize);

#ifdef IPV6_V6ONLY
    if (aa.a.sa_family == AF_INET6) {
        int ipv6only = 0;
        if (address.protocol() == QAbstractSocket::IPv6Protocol)
            ipv6only = 1;
        //default value of this socket option varies depending on unix variant (or system configuration on BSD), so always set it explicitly
        ::setsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&ipv6only, sizeof(ipv6only) );
    }
#endif

    int bindResult = QT_SOCKET_BIND(socketDescriptor, &aa.a, sockAddrSize);
    if (bindResult < 0 && errno == EAFNOSUPPORT && address.protocol() == QAbstractSocket::AnyIPProtocol) {
        // retry with v4
        aa.a4.sin_family = AF_INET;
        aa.a4.sin_port = htons(port);
        aa.a4.sin_addr.s_addr = htonl(address.toIPv4Address());
        sockAddrSize = sizeof(aa.a4);
        bindResult = QT_SOCKET_BIND(socketDescriptor, &aa.a, sockAddrSize);
    }

    if (bindResult < 0) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        int ecopy = errno;
#endif
        switch(errno) {
        case EADDRINUSE:
            setError(QAbstractSocket::AddressInUseError, AddressInuseErrorString);
            break;
        case EACCES:
            setError(QAbstractSocket::SocketAccessError, AddressProtectedErrorString);
            break;
        case EINVAL:
            setError(QAbstractSocket::UnsupportedSocketOperationError, OperationUnsupportedErrorString);
            break;
        case EADDRNOTAVAIL:
            setError(QAbstractSocket::SocketAddressNotAvailableError, AddressNotAvailableErrorString);
            break;
        default:
            break;
        }

#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::nativeBind(%s, %i) == false (%s)",
               address.toString().toLatin1().constData(), port, strerror(ecopy));
#endif

        return false;
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeBind(%s, %i) == true",
           address.toString().toLatin1().constData(), port);
#endif
    socketState = QAbstractSocket::BoundState;
    return true;
}